

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  char cVar1;
  uint uVar2;
  TextRange *pTVar3;
  char *needle_end;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  char *haystack;
  bool bVar7;
  
  uVar2 = (this->Filters).Size;
  if ((ulong)uVar2 == 0) {
    bVar7 = true;
  }
  else {
    haystack = "";
    if (text != (char *)0x0) {
      haystack = text;
    }
    pTVar3 = (this->Filters).Data;
    lVar6 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    do {
      if (uVar5 * 0x10 == lVar6) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x354,
                      "const value_type &ImVector<ImGuiTextFilter::TextRange>::operator[](int) const [T = ImGuiTextFilter::TextRange]"
                     );
      }
      pcVar4 = *(char **)((long)&pTVar3->b + lVar6);
      needle_end = *(char **)((long)&pTVar3->e + lVar6);
      if (pcVar4 != needle_end) {
        cVar1 = *pcVar4;
        if (cVar1 == '-') {
          pcVar4 = pcVar4 + 1;
        }
        pcVar4 = ImStristr(haystack,text_end,pcVar4,needle_end);
        if (pcVar4 != (char *)0x0) {
          return cVar1 != '-';
        }
      }
      lVar6 = lVar6 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar6);
    bVar7 = this->CountGrep == 0;
  }
  return bVar7;
}

Assistant:

bool ImGuiTextFilter::PassFilter(const char* text, const char* text_end) const
{
    if (Filters.empty())
        return true;

    if (text == NULL)
        text = "";

    for (int i = 0; i != Filters.Size; i++)
    {
        const TextRange& f = Filters[i];
        if (f.empty())
            continue;
        if (f.front() == '-')
        {
            // Subtract
            if (ImStristr(text, text_end, f.begin()+1, f.end()) != NULL)
                return false;
        }
        else
        {
            // Grep
            if (ImStristr(text, text_end, f.begin(), f.end()) != NULL)
                return true;
        }
    }

    // Implicit * grep
    if (CountGrep == 0)
        return true;

    return false;
}